

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_container_unit.c
# Opt level: O0

void select_test(void)

{
  run_container_t *container;
  uint16_t value_1;
  uint32_t start_rank;
  uint32_t element;
  uint32_t i;
  uint16_t value;
  uint16_t base;
  run_container_t *B;
  int in_stack_ffffffffffffffdc;
  undefined6 in_stack_ffffffffffffffe0;
  uint16_t in_stack_ffffffffffffffe6;
  uint32_t in_stack_ffffffffffffffe8;
  uint32_t uVar1;
  uint32_t in_stack_ffffffffffffffec;
  uint32_t uVar2;
  undefined4 in_stack_fffffffffffffff0;
  int iVar3;
  undefined2 in_stack_fffffffffffffff4;
  ushort uVar4;
  undefined2 in_stack_fffffffffffffff6;
  ushort uVar5;
  ushort uVar6;
  
  container = run_container_create();
  _assert_true(CONCAT26(in_stack_fffffffffffffff6,
                        CONCAT24(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0)),
               (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
               (char *)CONCAT26(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc);
  uVar5 = 0x1b;
  for (uVar4 = 0x1b; (uint)uVar4 < uVar5 + 200; uVar4 = uVar4 + 5) {
    run_container_add((run_container_t *)
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      in_stack_ffffffffffffffe6);
  }
  iVar3 = 0;
  uVar2 = 0;
  uVar6 = uVar5;
  for (; (uint)uVar5 < uVar6 + 200; uVar5 = uVar5 + 5) {
    uVar1 = 0xc;
    run_container_select
              (container,(uint32_t *)&stack0xffffffffffffffe8,iVar3 + 0xc,
               (uint32_t *)&stack0xffffffffffffffec);
    _assert_true(CONCAT26(uVar6,CONCAT24(uVar4,iVar3)),(char *)CONCAT44(uVar2,uVar1),
                 (char *)CONCAT26(uVar5,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    _assert_int_equal(CONCAT26(uVar6,CONCAT24(uVar4,iVar3)),CONCAT44(uVar2,uVar1),
                      (char *)CONCAT26(uVar5,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    iVar3 = iVar3 + 1;
  }
  uVar1 = 0xc;
  run_container_select
            (container,(uint32_t *)&stack0xffffffffffffffe8,iVar3 + 0xc,
             (uint32_t *)&stack0xffffffffffffffec);
  _assert_true(CONCAT26(uVar6,CONCAT24(uVar4,iVar3)),(char *)CONCAT44(uVar2,uVar1),
               (char *)CONCAT26(uVar5,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  _assert_int_equal(CONCAT26(uVar6,CONCAT24(uVar4,iVar3)),CONCAT44(uVar2,uVar1),
                    (char *)CONCAT26(uVar5,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  run_container_free((run_container_t *)0x10387a);
  return;
}

Assistant:

DEFINE_TEST(select_test) {
    run_container_t* B = run_container_create();
    assert_non_null(B);
    uint16_t base = 27;
    for (uint16_t value = base; value < base + 200; value += 5) {
        run_container_add(B, value);
    }
    uint32_t i = 0;
    uint32_t element = 0;
    uint32_t start_rank;
    for (uint16_t value = base; value < base + 200; value += 5) {
        start_rank = 12;
        assert_true(run_container_select(B, &start_rank, i + 12, &element));
        assert_int_equal(element, value);
        i++;
    }
    start_rank = 12;
    assert_false(run_container_select(B, &start_rank, i + 12, &element));
    assert_int_equal(start_rank, i + 12);
    run_container_free(B);
}